

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O2

ssize_t __thiscall
SubdirsMetaMakefileGenerator::write
          (SubdirsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  Subdir *p;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int ind;
  int iVar5;
  char *pcVar6;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> local_d8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qmake_getpwd();
  QFile::fileName();
  for (uVar7 = 0; uVar1 = (this->subs).d.size, uVar7 < uVar1; uVar7 = uVar7 + 1) {
    p = (this->subs).d.ptr[uVar7];
    qmake_setpwd(&p->input_dir);
    QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)&p->output_dir);
    QFileInfo::absoluteFilePath();
    qVar4 = Option::output_dir.d.size;
    pcVar3 = Option::output_dir.d.ptr;
    pDVar2 = Option::output_dir.d.d;
    Option::output_dir.d.d = (Data *)local_d8.a.a;
    Option::output_dir.d.ptr = (char16_t *)local_d8.a.b;
    local_d8.a.a = (QString *)pDVar2;
    local_d8.a.b = (char (*) [2])pcVar3;
    Option::output_dir.d.size = (qsizetype)local_d8.b.d.d;
    local_d8.b.d.d = (Data *)qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QFileInfo::~QFileInfo((QFileInfo *)&local_80);
    QFile::setFileName((QString *)Option::output);
    if ((this->subs).d.size - 1U != uVar7) {
      for (iVar5 = 0; iVar5 < p->indent; iVar5 = iVar5 + 1) {
        putchar(0x20);
      }
      QFile::fileName();
      local_d8.b.d.size = local_f8.size;
      local_d8.b.d.ptr = local_f8.ptr;
      local_d8.b.d.d = local_f8.d;
      local_d8.a.a = &Option::output_dir;
      local_d8.a.b = (char (*) [2])0x218d3b;
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_f8.size = 0;
      QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::convertTo<QString>
                ((QString *)&local_b0,&local_d8);
      QDir::cleanPath((QString *)&local_98);
      QString::toLatin1_helper_inplace((QString *)&local_80);
      pcVar6 = local_80.ptr;
      if (local_80.ptr == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      printf("Writing %s\n",pcVar6);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    }
    iVar5 = (*p->makefile->_vptr_MetaMakefileGenerator[4])();
    if ((char)iVar5 == '\0') break;
    qmake_setpwd((QString *)&local_50);
    QFile::setFileName((QString *)Option::output);
    QString::operator=(&Option::output_dir,(QString *)&Option::output_dir);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CONCAT71((int7)((ulong)this >> 8),uVar1 <= uVar7) & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool
SubdirsMetaMakefileGenerator::write()
{
    bool ret = true;
    const QString &pwd = qmake_getpwd();
    const QString &output_dir = Option::output_dir;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < subs.size(); i++) {
        const Subdir *sub = subs.at(i);
        qmake_setpwd(sub->input_dir);
        Option::output_dir = QFileInfo(sub->output_dir).absoluteFilePath();
        Option::output.setFileName(sub->output_file);
        if(i != subs.size()-1) {
            for (int ind = 0; ind < sub->indent; ++ind)
                printf(" ");
            printf("Writing %s\n", QDir::cleanPath(Option::output_dir+"/"+
                                                   Option::output.fileName()).toLatin1().constData());
        }
        if (!(ret = sub->makefile->write()))
            break;
        //restore because I'm paranoid
        qmake_setpwd(pwd);
        Option::output.setFileName(output_name);
        Option::output_dir = output_dir;
    }
    return ret;
}